

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O3

void __thiscall p2t::SweepContext::MapTriangleToNodes(SweepContext *this,Triangle *t)

{
  AdvancingFront *this_00;
  Point *point;
  Node *pNVar1;
  long lVar2;
  
  lVar2 = 4;
  do {
    if (*(long *)(t->constrained_edge + lVar2 * 8) == 0) {
      this_00 = this->front_;
      point = Triangle::PointCW(t,*(Point **)(t->constrained_edge + lVar2 * 8 + -0x18));
      pNVar1 = AdvancingFront::LocatePoint(this_00,point);
      if (pNVar1 != (Node *)0x0) {
        pNVar1->triangle = t;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void SweepContext::MapTriangleToNodes(Triangle& t)
{
  for (int i = 0; i < 3; i++) {
    if (!t.GetNeighbor(i)) {
      Node* n = front_->LocatePoint(t.PointCW(*t.GetPoint(i)));
      if (n)
        n->triangle = &t;
    }
  }
}